

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

bool __thiscall draco::ObjEncoder::IsNewEdge(ObjEncoder *this,CornerTable *ct,CornerIndex ci)

{
  PointAttribute *pPVar1;
  size_t __n;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar2;
  uint8_t value;
  char local_9;
  
  if ((int)ci.value_ < 0) {
    IVar2.value_ = 0xffffffff;
  }
  else {
    IVar2.value_ = (this->in_mesh_->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(ulong)ci.value_ / 3]._M_elems
                   [ci.value_ % 3].value_;
  }
  pPVar1 = this->added_edges_att_;
  if (pPVar1 != (PointAttribute *)0x0) {
    if (pPVar1->identity_mapping_ == false) {
      IVar2.value_ = (pPVar1->indices_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[IVar2.value_].value_;
    }
    __n = (pPVar1->super_GeometryAttribute).byte_stride_;
    memcpy(&local_9,(void *)((long)(((pPVar1->super_GeometryAttribute).buffer_)->data_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                             (pPVar1->super_GeometryAttribute).byte_offset_ + IVar2.value_ * __n),
           __n);
    return local_9 == '\x01';
  }
  return false;
}

Assistant:

inline PointIndex CornerToPointId(int ci) const {
    if (ci < 0 || static_cast<uint32_t>(ci) == kInvalidCornerIndex.value()) {
      return kInvalidPointIndex;
    }
    return this->face(FaceIndex(ci / 3))[ci % 3];
  }